

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O0

void Abc_WriteKLut(FILE *pFile,int nLutSize)

{
  int iVar1;
  int local_20;
  int nPars;
  int iNext;
  int iVar;
  int i;
  int nLutSize_local;
  FILE *pFile_local;
  
  iVar1 = 1 << ((byte)nLutSize & 0x1f);
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".model lut%d\n",(ulong)(uint)nLutSize);
  fprintf((FILE *)pFile,".inputs");
  for (iNext = 0; iNext < iVar1; iNext = iNext + 1) {
    fprintf((FILE *)pFile," p%02d",(ulong)(uint)iNext);
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".inputs");
  for (iNext = 0; iNext < nLutSize; iNext = iNext + 1) {
    fprintf((FILE *)pFile," i%d",(ulong)(uint)iNext);
  }
  fprintf((FILE *)pFile,"\n");
  fprintf((FILE *)pFile,".outputs o\n");
  fprintf((FILE *)pFile,".names n01 o\n");
  fprintf((FILE *)pFile,"1 1\n");
  nPars = 0;
  local_20 = 2;
  for (iNext = 1; iNext < iVar1; iNext = iNext + 1) {
    if (iNext == local_20) {
      local_20 = local_20 << 1;
      nPars = nPars + 1;
    }
    if (nPars == nLutSize + -1) {
      fprintf((FILE *)pFile,".names i%d p%02d p%02d n%02d\n",(ulong)(uint)nPars,
              (ulong)(uint)((iNext - iVar1 / 2) * 2),(ulong)((iNext - iVar1 / 2) * 2 + 1),
              (ulong)(uint)iNext);
    }
    else {
      fprintf((FILE *)pFile,".names i%d n%02d n%02d n%02d\n",(ulong)(uint)nPars,
              (ulong)(uint)(iNext << 1),(ulong)(iNext * 2 + 1),(ulong)(uint)iNext);
    }
    fprintf((FILE *)pFile,"01- 1\n");
    fprintf((FILE *)pFile,"1-1 1\n");
  }
  fprintf((FILE *)pFile,".end\n");
  fprintf((FILE *)pFile,"\n");
  return;
}

Assistant:

void Abc_WriteKLut( FILE * pFile, int nLutSize )
{
    int i, iVar, iNext, nPars = (1 << nLutSize);
    fprintf( pFile, "\n" ); 
    fprintf( pFile, ".model lut%d\n", nLutSize );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nPars; i++ )
        fprintf( pFile, " p%02d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".inputs" );
    for ( i = 0; i < nLutSize; i++ )
        fprintf( pFile, " i%d", i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs o\n" ); 
    fprintf( pFile, ".names n01 o\n" ); 
    fprintf( pFile, "1 1\n" ); 
    // write internal MUXes
    iVar = 0;
    iNext = 2;
    for ( i = 1; i < nPars; i++ )
    {
        if ( i == iNext )
        {
            iNext *= 2;
            iVar++; 
        }
        if ( iVar == nLutSize - 1 )
            fprintf( pFile, ".names i%d p%02d p%02d n%02d\n", iVar, 2*(i-nPars/2), 2*(i-nPars/2)+1, i ); 
        else
            fprintf( pFile, ".names i%d n%02d n%02d n%02d\n", iVar, 2*i, 2*i+1, i ); 
        fprintf( pFile, "01- 1\n" ); 
        fprintf( pFile, "1-1 1\n" ); 
    }
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
}